

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_impl.hpp
# Opt level: O2

string * __thiscall
toml::to_string_abi_cxx11_(string *__return_storage_ptr__,toml *this,integer_format c)

{
  ostringstream oss;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  operator<<((ostream *)local_190,(integer_format)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string to_string(const integer_format c)
{
    std::ostringstream oss;
    oss << c;
    return oss.str();
}